

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cardinality_estimator.cpp
# Opt level: O1

vector<unsigned_long,_true> *
duckdb::SubgraphsConnectedByEdge
          (vector<unsigned_long,_true> *__return_storage_ptr__,FilterInfoWithTotalDomains *edge,
          vector<duckdb::Subgraph2Denominator,_true> *subgraphs)

{
  pointer pSVar1;
  iterator iVar2;
  pointer puVar3;
  bool bVar4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  unsigned_long local_40;
  ulong local_38;
  
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (((subgraphs->
       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>).
       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (subgraphs->
       super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>).
       super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_40 = 0,
     (subgraphs->
     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>).
     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
     ._M_impl.super__Vector_impl_data._M_finish ==
     (subgraphs->
     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>).
     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
     ._M_impl.super__Vector_impl_data._M_start)) {
    return __return_storage_ptr__;
  }
  bVar6 = false;
  local_38 = local_40;
LAB_00d1c866:
  do {
    local_38 = local_38 + 1;
    pSVar1 = (subgraphs->
             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ).
             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(subgraphs->
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ).
                   super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
            -0x5555555555555555;
    bVar7 = local_38 != uVar5;
    if (bVar7) {
      if (uVar5 < local_40 || uVar5 - local_40 == 0) {
LAB_00d1c9f6:
        ::std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      bVar4 = EdgeConnects(edge,pSVar1 + local_40);
      if (!bVar4) goto LAB_00d1c866;
      pSVar1 = (subgraphs->
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ).
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(subgraphs->
                     super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ).
                     super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
              -0x5555555555555555;
      if (uVar5 < local_38 || uVar5 - local_38 == 0) goto LAB_00d1c9f6;
      bVar4 = EdgeConnects(edge,pSVar1 + local_38);
      if (!bVar4) goto LAB_00d1c866;
      iVar2._M_current =
           (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   iVar2,&local_40);
      }
      else {
        *iVar2._M_current = local_40;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      iVar2._M_current =
           (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        bVar6 = true;
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                   iVar2,&local_38);
      }
      else {
        *iVar2._M_current = local_38;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        bVar6 = true;
      }
    }
    if (bVar7) {
      if (bVar6) {
        return __return_storage_ptr__;
      }
      puVar3 = (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>)
               .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (puVar3 == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(puVar3);
      return __return_storage_ptr__;
    }
    pSVar1 = (subgraphs->
             super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ).
             super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(subgraphs->
                   super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ).
                   super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) *
            -0x5555555555555555;
    if (uVar5 < local_40 || uVar5 - local_40 == 0) {
      ::std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    bVar7 = EdgeConnects(edge,pSVar1 + local_40);
    if (bVar7) {
      iVar2._M_current =
           (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current !=
          (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *iVar2._M_current = local_40;
        (__return_storage_ptr__->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
        return __return_storage_ptr__;
      }
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,iVar2
                 ,&local_40);
      return __return_storage_ptr__;
    }
    local_38 = local_40 + 1;
    local_40 = local_38;
    if (local_38 ==
        ((long)(subgraphs->
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ).
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(subgraphs->
               super_vector<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ).
               super__Vector_base<duckdb::Subgraph2Denominator,_std::allocator<duckdb::Subgraph2Denominator>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

vector<idx_t> SubgraphsConnectedByEdge(FilterInfoWithTotalDomains &edge, vector<Subgraph2Denominator> &subgraphs) {
	vector<idx_t> res;
	if (subgraphs.empty()) {
		return res;
	} else {
		// check the combinations of subgraphs and see if the edge connects two of them,
		// if so, return the indexes of the two subgraphs within the vector
		for (idx_t outer = 0; outer != subgraphs.size(); outer++) {
			// check if the edge connects two subgraphs.
			for (idx_t inner = outer + 1; inner != subgraphs.size(); inner++) {
				if (EdgeConnects(edge, subgraphs.at(outer)) && EdgeConnects(edge, subgraphs.at(inner))) {
					// order is important because we will delete the inner subgraph later
					res.push_back(outer);
					res.push_back(inner);
					return res;
				}
			}
			// if the edge does not connect two subgraphs, see if the edge connects with just outer
			// merge subgraph.at(outer) with the RelationSet(s) that edge connects
			if (EdgeConnects(edge, subgraphs.at(outer))) {
				res.push_back(outer);
				return res;
			}
		}
	}
	// this edge connects only the relations it connects. Return an empty result so a new subgraph is created.
	return res;
}